

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qapplication.cpp
# Opt level: O0

bool QApplication::isEffectEnabled(UIEffect effect)

{
  int iVar1;
  uint uVar2;
  QCoreApplication *pQVar3;
  UIEffect in_EDI;
  long in_FS_OFFSET;
  undefined4 in_stack_ffffffffffffffb8;
  int in_stack_ffffffffffffffbc;
  uint in_stack_ffffffffffffffc0;
  uint in_stack_ffffffffffffffc4;
  uint uVar4;
  undefined4 in_stack_ffffffffffffffcc;
  byte bVar5;
  QColormap in_stack_ffffffffffffffd0;
  char local_28 [32];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar3 = QCoreApplication::instance();
  if (pQVar3 == (QCoreApplication *)0x0) {
    QMessageLogger::QMessageLogger
              ((QMessageLogger *)in_stack_ffffffffffffffd0.d,
               (char *)CONCAT44(in_stack_ffffffffffffffcc,in_EDI),in_stack_ffffffffffffffc4,
               (char *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
    QMessageLogger::warning(local_28,"Must construct a QApplication first.");
    bVar5 = 0;
  }
  else {
    QColormap::instance(in_stack_ffffffffffffffbc);
    iVar1 = QColormap::depth((QColormap *)&stack0xffffffffffffffd0);
    uVar4 = in_stack_ffffffffffffffc4 & 0xffffff;
    if ((0xf < iVar1) &&
       (uVar4 = in_stack_ffffffffffffffc4 & 0xffffff,
       (QApplicationPrivate::enabledAnimations & 1U) != 0)) {
      in_stack_ffffffffffffffc0 = QApplicationPrivate::enabledAnimations;
      uVar2 = uiEffectToFlag(in_EDI);
      uVar4 = CONCAT13((in_stack_ffffffffffffffc0 & uVar2) != 0,(int3)uVar4);
    }
    bVar5 = (byte)(uVar4 >> 0x18);
    QColormap::~QColormap((QColormap *)CONCAT44(uVar4,in_stack_ffffffffffffffc0));
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (bool)(bVar5 & 1);
  }
  __stack_chk_fail();
}

Assistant:

bool QApplication::isEffectEnabled(Qt::UIEffect effect)
{
    CHECK_QAPP_INSTANCE(false)
    return QColormap::instance().depth() >= 16
           && (QApplicationPrivate::enabledAnimations & QPlatformTheme::GeneralUiEffect)
           && (QApplicationPrivate::enabledAnimations & uiEffectToFlag(effect));
}